

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptStringObject::SetProperty
          (JavascriptStringObject *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  bool bVar1;
  BOOL BVar2;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  bool local_31 [8];
  bool result;
  
  propertyRecord = (PropertyRecord *)info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_48);
  if ((local_48 != (PropertyRecord *)0x0) &&
     (bVar1 = SetPropertyBuiltIns(this,local_48->pid,flags,local_31), bVar1)) {
    return (uint)local_31[0];
  }
  BVar2 = DynamicObject::SetProperty
                    (&this->super_DynamicObject,propertyNameString,value,flags,
                     (PropertyValueInfo *)propertyRecord);
  return BVar2;
}

Assistant:

BOOL JavascriptStringObject::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        bool result;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && SetPropertyBuiltIns(propertyRecord->GetPropertyId(), flags, &result))
        {
            return result;
        }
        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }